

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_plugin.c
# Opt level: O3

int mk_plugin_header_add(mk_http_request *sr,char *row,int len)

{
  char *pcVar1;
  int iVar2;
  iovec *piVar3;
  unsigned_long uVar4;
  long lVar5;
  mk_iov *pmVar6;
  char *pcVar7;
  mk_http_request *pmVar8;
  
  if (sr != (mk_http_request *)0x0) {
    pmVar6 = (sr->headers)._extra_rows;
    if (pmVar6 == (mk_iov *)0x0) {
      pmVar8 = (mk_http_request *)0x24;
      pcVar7 = (char *)0x0;
      pmVar6 = mk_iov_create(0x24,0);
      (sr->headers)._extra_rows = pmVar6;
      sr = pmVar8;
      if (pmVar6 == (mk_iov *)0x0) goto LAB_001105cb;
    }
    piVar3 = pmVar6->io;
    iVar2 = pmVar6->iov_idx;
    piVar3[iVar2].iov_base = row;
    piVar3[iVar2].iov_len = (long)len;
    uVar4 = pmVar6->total_len;
    piVar3[(long)iVar2 + 1].iov_base = "\r\n";
    piVar3[(long)iVar2 + 1].iov_len = 2;
    pmVar6->iov_idx = iVar2 + 2;
    pmVar6->total_len = (long)len + uVar4 + 2;
    return 0;
  }
  mk_plugin_header_add_cold_2();
  pcVar7 = row;
LAB_001105cb:
  mk_plugin_header_add_cold_1();
  pcVar1 = pcVar7 + 0x58;
  lVar5 = *(long *)&sr->stream;
  *(char **)&sr->stream = pcVar1;
  *(mk_stream **)(pcVar7 + 0x60) = &sr->stream;
  *(long *)(pcVar7 + 0x58) = lVar5;
  *(char **)(lVar5 + 8) = pcVar1;
  return (int)pcVar1;
}

Assistant:

int mk_plugin_header_add(struct mk_http_request *sr, char *row, int len)
{
    mk_bug(!sr);

    if (!sr->headers._extra_rows) {
        /*
         * We allocate space for a fixed number of IOV entries:
         *
         *   MK_PLUGIN_HEADER_EXTRA_ROWS = X
         *
         *  we use (MK_PLUGIN_HEADER_EXTRA_ROWS * 2) thinking in an ending CRLF
         */
        sr->headers._extra_rows = mk_iov_create(MK_PLUGIN_HEADER_EXTRA_ROWS * 2, 0);
        mk_bug(!sr->headers._extra_rows);
    }

    mk_iov_add(sr->headers._extra_rows, row, len,
               MK_FALSE);
    mk_iov_add(sr->headers._extra_rows,
               mk_iov_crlf.data, mk_iov_crlf.len,
               MK_FALSE);
    return 0;
}